

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O1

void __thiscall indigox::Atom::RemoveBond(Atom *this,Bond_p *b)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  iterator __position;
  bool bVar5;
  
  __position._M_current =
       (this->bonds_).
       super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->bonds_).
      super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = ((__position._M_current)->
                super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar3 = this_00->_M_use_count;
        do {
          if (iVar3 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar5 = iVar3 == iVar1;
          if (bVar5) {
            this_00->_M_use_count = iVar3 + 1;
            iVar1 = iVar3;
          }
          iVar3 = iVar1;
          UNLOCK();
        } while (!bVar5);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = this_00->_M_use_count == 0;
      }
      if (bVar5) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = ((__position._M_current)->
                 super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      peVar2 = (b->super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    } while ((peVar4 != peVar2) &&
            (__position._M_current = __position._M_current + 1,
            __position._M_current !=
            (this->bonds_).
            super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
            ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (__position._M_current ==
      (this->bonds_).
      super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::
  _M_erase(&this->bonds_,__position);
  return;
}

Assistant:

void Atom::RemoveBond(Bond_p b) {
    AtomBondIterator it = bonds_.begin();
    for (; it != bonds_.end(); ++it) {
      if (it->lock() == b) break;
    }
    if (it != bonds_.end()) bonds_.erase(it);
  }